

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateBufferBackedInterfaceResourceBasicBlockTypes
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,Storage storage,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr
               *blockContentGenerator)

{
  deInt32 *pdVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  Node *pNVar4;
  ProgramInterface PVar5;
  SharedPtr dummyVariable;
  SharedPtr block;
  SharedPtr dummyVariable_2;
  SharedPtr binding;
  SharedPtr local_d0;
  Node *local_c0;
  SharedPtrStateBase *pSStack_b8;
  MatrixOrder local_b0;
  SharedPtr local_a8;
  Node *local_98;
  SharedPtrStateBase *local_90;
  Context *local_88;
  TestCaseGroup *local_80;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr *local_78;
  Node *local_70;
  SharedPtrStateBase *local_68;
  Node *local_60;
  SharedPtrStateBase *local_58;
  Node *local_50;
  SharedPtrStateBase *local_48;
  Node *local_40;
  SharedPtrStateBase *local_38;
  
  local_88 = context;
  local_80 = targetGroup;
  local_78 = blockContentGenerator;
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->m_type = TYPE_PROGRAM;
  (pNVar2->m_enclosingNode).m_ptr = (Node *)0x0;
  (pNVar2->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b250;
  *(undefined1 *)&pNVar2[1]._vptr_Node = 0;
  local_40 = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_38 = pSVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar4->m_type = TYPE_SHADER;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b2f8;
  *(undefined4 *)&pNVar4[1]._vptr_Node = 5;
  *(GLSLVersion *)((long)&pNVar4[1]._vptr_Node + 4) = glslVersion;
  local_50 = pNVar4;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_48 = pSVar3;
  pNVar2 = (Node *)operator_new(0x20);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar2->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar2->m_enclosingNode).m_ptr = pNVar4;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b330;
  local_60 = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_58 = pSVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar4->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
  *(Storage *)&pNVar4[1]._vptr_Node = storage;
  local_70 = pNVar4;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_68 = pSVar3;
  pNVar2 = (Node *)operator_new(0x38);
  glu::Layout::Layout((Layout *)&local_c0,-1,1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar2->m_type = TYPE_LAYOUT_QUALIFIER;
  (pNVar2->m_enclosingNode).m_ptr = pNVar4;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
  pNVar2[1]._vptr_Node = (_func_int **)local_c0;
  *(SharedPtrStateBase **)&pNVar2[1].m_type = pSStack_b8;
  *(MatrixOrder *)&pNVar2[1].m_enclosingNode.m_ptr = local_b0;
  local_90 = (SharedPtrStateBase *)0x0;
  local_98 = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  PVar5 = PROGRAMINTERFACE_SHADER_STORAGE_BLOCK;
  if (storage == STORAGE_UNIFORM) {
    PVar5 = PROGRAMINTERFACE_UNIFORM_BLOCK;
  }
  local_90 = pSVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar4->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
  *(undefined1 *)&pNVar4[1]._vptr_Node = 1;
  pSStack_b8 = (SharedPtrStateBase *)0x0;
  local_c0 = pNVar4;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSStack_b8 = pSVar3;
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar2->m_type = TYPE_VARIABLE;
  (pNVar2->m_enclosingNode).m_ptr = pNVar4;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 0x25;
  local_d0.m_state = (SharedPtrStateBase *)0x0;
  local_d0.m_ptr = pNVar2;
  local_d0.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_d0.m_state)->strongRefCount = 0;
  (local_d0.m_state)->weakRefCount = 0;
  (local_d0.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  local_d0.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  (local_d0.m_state)->strongRefCount = 1;
  (local_d0.m_state)->weakRefCount = 1;
  (*local_78)(local_88,&local_d0,local_80,PVar5,"named_block");
  if (local_d0.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_d0.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_d0.m_ptr = (Node *)0x0;
      (*(local_d0.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_d0.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_d0.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_d0.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = pSStack_b8;
  if (pSStack_b8 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_b8->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c0 = (Node *)0x0;
      (*pSStack_b8->_vptr_SharedPtrStateBase[2])(pSStack_b8);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (pSStack_b8 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_b8->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar2->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar2->m_enclosingNode).m_ptr = local_98;
  (pNVar2->m_enclosingNode).m_state = local_90;
  if (local_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_90->strongRefCount = local_90->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
  *(undefined1 *)&pNVar2[1]._vptr_Node = 0;
  pSStack_b8 = (SharedPtrStateBase *)0x0;
  local_c0 = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSStack_b8 = pSVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar4->m_type = TYPE_VARIABLE;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar4[1]._vptr_Node = 0x25;
  local_d0.m_state = (SharedPtrStateBase *)0x0;
  local_d0.m_ptr = pNVar4;
  local_d0.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_d0.m_state)->strongRefCount = 0;
  (local_d0.m_state)->weakRefCount = 0;
  (local_d0.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  local_d0.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  (local_d0.m_state)->strongRefCount = 1;
  (local_d0.m_state)->weakRefCount = 1;
  (*local_78)(local_88,&local_d0,local_80,PVar5,"unnamed_block");
  if (local_d0.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_d0.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_d0.m_ptr = (Node *)0x0;
      (*(local_d0.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_d0.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_d0.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_d0.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = pSStack_b8;
  if (pSStack_b8 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_b8->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c0 = (Node *)0x0;
      (*pSStack_b8->_vptr_SharedPtrStateBase[2])(pSStack_b8);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (pSStack_b8 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_b8->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar2->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar2->m_enclosingNode).m_ptr = local_98;
  (pNVar2->m_enclosingNode).m_state = local_90;
  if (local_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_90->strongRefCount = local_90->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 3;
  pSStack_b8 = (SharedPtrStateBase *)0x0;
  local_c0 = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSStack_b8 = pSVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar4->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
  *(undefined1 *)&pNVar4[1]._vptr_Node = 1;
  local_d0.m_state = (SharedPtrStateBase *)0x0;
  local_d0.m_ptr = pNVar4;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_d0.m_state = pSVar3;
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar2->m_type = TYPE_VARIABLE;
  (pNVar2->m_enclosingNode).m_ptr = pNVar4;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 0x25;
  local_a8.m_state = (SharedPtrStateBase *)0x0;
  local_a8.m_ptr = pNVar2;
  local_a8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_a8.m_state)->strongRefCount = 0;
  (local_a8.m_state)->weakRefCount = 0;
  (local_a8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  local_a8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  (local_a8.m_state)->strongRefCount = 1;
  (local_a8.m_state)->weakRefCount = 1;
  (*local_78)(local_88,&local_a8,local_80,PVar5,"block_array");
  if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_a8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_a8.m_ptr = (Node *)0x0;
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_a8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = local_d0.m_state;
  if (local_d0.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_d0.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_d0.m_ptr = (Node *)0x0;
      (*(local_d0.m_state)->_vptr_SharedPtrStateBase[2])(local_d0.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_d0.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_d0.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = pSStack_b8;
  if (pSStack_b8 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_b8->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c0 = (Node *)0x0;
      (*pSStack_b8->_vptr_SharedPtrStateBase[2])(pSStack_b8);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (pSStack_b8 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_b8->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar2->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar2->m_enclosingNode).m_ptr = local_98;
  (pNVar2->m_enclosingNode).m_state = local_90;
  if (local_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_90->strongRefCount = local_90->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 1;
  pSStack_b8 = (SharedPtrStateBase *)0x0;
  local_c0 = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSStack_b8 = pSVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar4->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
  *(undefined1 *)&pNVar4[1]._vptr_Node = 1;
  local_d0.m_state = (SharedPtrStateBase *)0x0;
  local_d0.m_ptr = pNVar4;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_d0.m_state = pSVar3;
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar2->m_type = TYPE_VARIABLE;
  (pNVar2->m_enclosingNode).m_ptr = pNVar4;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 0x25;
  local_a8.m_state = (SharedPtrStateBase *)0x0;
  local_a8.m_ptr = pNVar2;
  local_a8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_a8.m_state)->strongRefCount = 0;
  (local_a8.m_state)->weakRefCount = 0;
  (local_a8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  local_a8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  (local_a8.m_state)->strongRefCount = 1;
  (local_a8.m_state)->weakRefCount = 1;
  (*local_78)(local_88,&local_a8,local_80,PVar5,"block_array_single_element");
  if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_a8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_a8.m_ptr = (Node *)0x0;
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_a8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = local_d0.m_state;
  if (local_d0.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_d0.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_d0.m_ptr = (Node *)0x0;
      (*(local_d0.m_state)->_vptr_SharedPtrStateBase[2])(local_d0.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_d0.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_d0.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = pSStack_b8;
  if (pSStack_b8 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_b8->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c0 = (Node *)0x0;
      (*pSStack_b8->_vptr_SharedPtrStateBase[2])(pSStack_b8);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (pSStack_b8 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_b8->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = local_90;
  if (local_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_90->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_98 = (Node *)0x0;
      (*local_90->_vptr_SharedPtrStateBase[2])(local_90);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_90 != (SharedPtrStateBase *)0x0)) {
      (*local_90->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = local_68;
  if (local_68 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_68->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_70 = (Node *)0x0;
      (*local_68->_vptr_SharedPtrStateBase[2])(local_68);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_68 != (SharedPtrStateBase *)0x0)) {
      (*local_68->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = local_58;
  if (local_58 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_58->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_60 = (Node *)0x0;
      (*local_58->_vptr_SharedPtrStateBase[2])(local_58);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_58 != (SharedPtrStateBase *)0x0)) {
      (*local_58->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = local_48;
  if (local_48 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_48->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_50 = (Node *)0x0;
      (*local_48->_vptr_SharedPtrStateBase[2])(local_48);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_48 != (SharedPtrStateBase *)0x0)) {
      (*local_48->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = local_38;
  if (local_38 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_38->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_40 = (Node *)0x0;
      (*local_38->_vptr_SharedPtrStateBase[2])(local_38);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_38 != (SharedPtrStateBase *)0x0)) {
      (*local_38->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateBufferBackedInterfaceResourceBasicBlockTypes (Context& context, tcu::TestCaseGroup* targetGroup, glu::GLSLVersion glslVersion, glu::Storage storage, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup* const, ProgramInterface interface, const char* blockName))
{
	const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program());
	const ResourceDefinition::Node::SharedPtr	shader				(new ResourceDefinition::Shader(program, glu::SHADERTYPE_COMPUTE, glslVersion));
	const ResourceDefinition::Node::SharedPtr	defaultBlock		(new ResourceDefinition::DefaultBlock(shader));
	const ResourceDefinition::Node::SharedPtr	storageQualifier	(new ResourceDefinition::StorageQualifier(defaultBlock, storage));
	const ResourceDefinition::Node::SharedPtr	binding				(new ResourceDefinition::LayoutQualifier(storageQualifier, glu::Layout(-1, 1)));
	const ProgramInterface						programInterface	= (storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) : (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK);

	// .named_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(binding, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "named_block");
	}

	// .unnamed_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(binding, false));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "unnamed_block");
	}

	// .block_array
	{
		const ResourceDefinition::Node::SharedPtr arrayElement	(new ResourceDefinition::ArrayElement(binding, 3));
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(arrayElement, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "block_array");
	}

	// .block_array_single_element
	{
		const ResourceDefinition::Node::SharedPtr arrayElement	(new ResourceDefinition::ArrayElement(binding, 1));
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(arrayElement, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "block_array_single_element");
	}
}